

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O2

void __thiscall
BamTools::Internal::BamStandardIndex::CalculateCandidateBins
          (BamStandardIndex *this,uint32_t *begin,uint32_t *end,
          set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
          *candidateBins)

{
  uint uVar1;
  uint uVar2;
  unsigned_short local_34;
  unsigned_short local_32;
  unsigned_short local_30;
  unsigned_short local_2e;
  unsigned_short local_2c [2];
  
  local_2c[1] = 0;
  std::
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  ::_M_insert_unique<unsigned_short>(&candidateBins->_M_t,local_2c + 1);
  uVar2 = *begin >> 0x1a;
  while (uVar1 = *end, uVar2 <= uVar1 >> 0x1a) {
    uVar2 = uVar2 + 1;
    local_2c[0] = (unsigned_short)uVar2;
    std::
    _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
    ::_M_insert_unique<unsigned_short>(&candidateBins->_M_t,local_2c);
  }
  for (uVar2 = (*begin >> 0x17) + 9; uVar2 <= (uVar1 >> 0x17) + 9; uVar2 = uVar2 + 1) {
    local_2e = (unsigned_short)uVar2;
    std::
    _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
    ::_M_insert_unique<unsigned_short>(&candidateBins->_M_t,&local_2e);
    uVar1 = *end;
  }
  for (uVar2 = (*begin >> 0x14) + 0x49; uVar2 <= (uVar1 >> 0x14) + 0x49; uVar2 = uVar2 + 1) {
    local_30 = (unsigned_short)uVar2;
    std::
    _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
    ::_M_insert_unique<unsigned_short>(&candidateBins->_M_t,&local_30);
    uVar1 = *end;
  }
  for (uVar2 = (*begin >> 0x11) + 0x249; uVar2 <= (uVar1 >> 0x11) + 0x249; uVar2 = uVar2 + 1) {
    local_32 = (unsigned_short)uVar2;
    std::
    _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
    ::_M_insert_unique<unsigned_short>(&candidateBins->_M_t,&local_32);
    uVar1 = *end;
  }
  for (uVar2 = (*begin >> 0xe) + 0x1249; uVar2 <= (uVar1 >> 0xe) + 0x1249; uVar2 = uVar2 + 1) {
    local_34 = (unsigned_short)uVar2;
    std::
    _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
    ::_M_insert_unique<unsigned_short>(&candidateBins->_M_t,&local_34);
    uVar1 = *end;
  }
  return;
}

Assistant:

void BamStandardIndex::CalculateCandidateBins(const uint32_t& begin,
                                              const uint32_t& end,
                                              set<uint16_t>& candidateBins)
{
    // initialize list, bin '0' is always a valid bin
    candidateBins.insert(0);

    // get rest of bins that contain this region
    unsigned int k;
    for (k =    1 + (begin>>26); k <=    1 + (end>>26); ++k) { candidateBins.insert(k); }
    for (k =    9 + (begin>>23); k <=    9 + (end>>23); ++k) { candidateBins.insert(k); }
    for (k =   73 + (begin>>20); k <=   73 + (end>>20); ++k) { candidateBins.insert(k); }
    for (k =  585 + (begin>>17); k <=  585 + (end>>17); ++k) { candidateBins.insert(k); }
    for (k = 4681 + (begin>>14); k <= 4681 + (end>>14); ++k) { candidateBins.insert(k); }
}